

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_statement.cpp
# Opt level: O1

string * __thiscall
duckdb::SetVariableStatement::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SetVariableStatement *this)

{
  pointer pcVar1;
  pointer pPVar2;
  SetScope scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  local_80[0] = local_70;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"SET %s %s TO %s;","");
  ScopeToString_abi_cxx11_(&local_40,(duckdb *)(ulong)(this->super_SetStatement).scope,scope);
  pcVar1 = (this->super_SetStatement).name._M_dataplus._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + (this->super_SetStatement).name._M_string_length);
  pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->value);
  (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_60,pPVar2);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_80,&local_40,&local_a0,&local_60,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string SetVariableStatement::ToString() const {
	return StringUtil::Format("SET %s %s TO %s;", ScopeToString(scope), name, value->ToString());
}